

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Slave *sp;
  int iVar1;
  Master m;
  
  m.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  m.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  m.slavepipes.
  super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  m.slavepipes.
  super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.slavepipes.
  super__Vector_base<std::pair<pipestruct,_pipestruct>,_std::allocator<std::pair<pipestruct,_pipestruct>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar1 = -4; iVar1 != 0; iVar1 = iVar1 + 1) {
    sp = (Slave *)operator_new(4);
    sp->reg = 0;
    sp->addr = (char)iVar1 + '\x05';
    Master::add_slave(&m,sp);
  }
  Master::run(&m);
  Master::~Master(&m);
  return 0;
}

Assistant:

int main(int argc, char ** argv) {


	Master m;
	for (int i = 1; i < 5; ++i) {
		auto s = new Slave(i);
		m.add_slave(s);
	}
	m.run();
	return 0;
}